

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

void Amap_LibWrite(FILE *pFile,Amap_Lib_t *pLib,int fPrintDsd)

{
  int iVar1;
  Amap_Gat_t *pGate_00;
  int local_2c;
  int i;
  Amap_Gat_t *pGate;
  int fPrintDsd_local;
  Amap_Lib_t *pLib_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"# The genlib library \"%s\".\n",pLib->pName);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pLib->vGates), local_2c < iVar1; local_2c = local_2c + 1) {
    pGate_00 = (Amap_Gat_t *)Vec_PtrEntry(pLib->vGates,local_2c);
    Amap_LibWriteGate(pFile,pGate_00,fPrintDsd);
  }
  return;
}

Assistant:

void Amap_LibWrite( FILE * pFile, Amap_Lib_t * pLib, int fPrintDsd )
{
    Amap_Gat_t * pGate;
    int i;
    fprintf( pFile, "# The genlib library \"%s\".\n", pLib->pName );
    Amap_LibForEachGate( pLib, pGate, i )
        Amap_LibWriteGate( pFile, pGate, fPrintDsd );
}